

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O0

void __thiscall pstore::command_line::word_wrapper::next(word_wrapper *this)

{
  unsigned_long *puVar1;
  char *pcVar2;
  bool bVar3;
  string local_48 [32];
  unsigned_long local_28;
  ulong local_20;
  size_t end_pos;
  size_type length;
  word_wrapper *this_local;
  
  length = (size_type)this;
  end_pos = std::__cxx11::string::length();
  local_28 = this->start_pos_ + this->max_width_;
  puVar1 = std::min<unsigned_long>(&local_28,&end_pos);
  local_20 = *puVar1;
  if (local_20 < end_pos) {
    while( true ) {
      bVar3 = false;
      if (local_20 != 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this->text_);
        bVar3 = *pcVar2 != ' ';
      }
      if (!bVar3) break;
      local_20 = local_20 - 1;
    }
    if (local_20 == this->start_pos_) {
      while( true ) {
        bVar3 = false;
        if (local_20 < end_pos) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this->text_);
          bVar3 = *pcVar2 != ' ';
        }
        if (!bVar3) break;
        local_20 = local_20 + 1;
      }
    }
  }
  if (local_20 < this->start_pos_) {
    assert_failed("end_pos >= start_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/word_wrapper.cpp"
                  ,0x53);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)this->text_);
  std::__cxx11::string::operator=((string *)&this->substr_,local_48);
  std::__cxx11::string::~string(local_48);
  while( true ) {
    bVar3 = false;
    if (local_20 < end_pos) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this->text_);
      bVar3 = *pcVar2 == ' ';
    }
    if (!bVar3) break;
    local_20 = local_20 + 1;
  }
  this->start_pos_ = local_20;
  return;
}

Assistant:

void word_wrapper::next () {
                auto const length = text_.length ();
                std::size_t end_pos = std::min (start_pos_ + max_width_, length);
                if (end_pos < length) {
                    while (end_pos > 0 && text_[end_pos] != ' ') {
                        --end_pos;
                    }
                    if (end_pos == start_pos_) {
                        // We got back to the start without finding a separator! We can't allow the
                        // next() operation to produce nothing (unless start_pos_ is at the end
                        // already). Try searching forward. This line will be too long, but that's
                        // better than looping forever.
                        while (end_pos < length && text_[end_pos] != ' ') {
                            ++end_pos;
                        }
                    }
                }

                PSTORE_ASSERT (end_pos >= start_pos_);
                substr_ = text_.substr (start_pos_, end_pos - start_pos_);

                while (end_pos < length && text_[end_pos] == ' ') {
                    ++end_pos;
                }
                start_pos_ = end_pos;
            }